

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHPublicKey.cpp
# Opt level: O0

ByteString * __thiscall DHPublicKey::serialise(DHPublicKey *this)

{
  ByteString *in_RDI;
  ByteString *in_stack_ffffffffffffff50;
  ByteString *in_stack_ffffffffffffff58;
  ByteString *in_stack_ffffffffffffff78;
  
  ByteString::serialise(in_stack_ffffffffffffff78);
  ByteString::serialise(in_stack_ffffffffffffff78);
  operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  ByteString::serialise(in_stack_ffffffffffffff78);
  operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  ByteString::~ByteString((ByteString *)0x1a5ea3);
  ByteString::~ByteString((ByteString *)0x1a5eb0);
  ByteString::~ByteString((ByteString *)0x1a5eba);
  ByteString::~ByteString((ByteString *)0x1a5ec4);
  return in_RDI;
}

Assistant:

ByteString DHPublicKey::serialise() const
{
	return p.serialise() +
	       g.serialise() +
	       y.serialise();
}